

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::WriteFor
               (uint *values,bool *validity,bitpacking_width_t width,uint frame_of_reference,
               idx_t count,void *data_ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  unsigned_long uVar4;
  uint *puVar5;
  idx_t iVar6;
  ulong uVar7;
  bitpacking_metadata_encoded_t encoded_value;
  ulong uVar8;
  ulong uVar9;
  uint *in;
  ulong uVar10;
  uint32_t local_b8 [34];
  
  iVar6 = count;
  if ((count & 0x1f) != 0) {
    uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)count & 0x1f);
    iVar6 = (count - uVar4) + 0x20;
  }
  uVar7 = iVar6 * width >> 3;
  FlushAndCreateSegmentIfFull
            ((BitpackingCompressionState<unsigned_int,_true,_int> *)data_ptr,uVar7 + 8,4);
  iVar1 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  lVar3 = *(long *)((long)data_ptr + 0x48);
  iVar2 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  *(long *)((long)data_ptr + 0x48) = lVar3 + -4;
  *(uint *)(lVar3 + -4) = iVar1 - iVar2 | 0x5000000;
  puVar5 = *(uint **)((long)data_ptr + 0x40);
  *puVar5 = frame_of_reference;
  puVar5[1] = (uint)width;
  puVar5 = puVar5 + 2;
  *(uint **)((long)data_ptr + 0x40) = puVar5;
  uVar10 = count & 0xffffffffffffffe0;
  if (uVar10 != 0) {
    uVar9 = 0;
    uVar8 = 0;
    in = values;
    do {
      duckdb_fastpforlib::fastpack(in,(uint32_t *)((uVar9 >> 3) + (long)puVar5),(uint)width);
      uVar8 = uVar8 + 0x20;
      in = in + 0x20;
      uVar9 = uVar9 + (ulong)width * 0x20;
    } while (uVar8 < uVar10);
  }
  if ((count & 0x1f) != 0) {
    uVar8 = (ulong)(((uint)count & 0x1f) << 2);
    switchD_010444a0::default((void *)((long)local_b8 + uVar8),0,0x80 - uVar8);
    switchD_015df945::default(local_b8,values + uVar10,uVar8);
    duckdb_fastpforlib::fastpack
              (local_b8,(uint32_t *)((long)puVar5 + (width * uVar10 >> 3)),(uint)width);
  }
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + uVar7;
  UpdateStats((BitpackingCompressionState<unsigned_int,_true,_int> *)data_ptr,count);
  return;
}

Assistant:

static void WriteFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference, idx_t count,
		                     void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 2 * sizeof(T));

			WriteMetaData(state, BitpackingMode::FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, (T)width);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}